

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

void __thiscall cmake::RunCheckForUnusedVariables(cmake *this)

{
  bool bVar1;
  bool bVar2;
  ostream *poVar3;
  cmListFileBacktrace local_1f8;
  string local_1e0;
  reference local_1c0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
  *it;
  iterator __end1;
  iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  *__range1;
  undefined1 local_190 [8];
  ostringstream msg;
  bool haveUnused;
  cmake *this_local;
  
  bVar1 = false;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  std::operator<<((ostream *)local_190,"Manually-specified variables were not used by the project:")
  ;
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
           ::begin(&this->UsedCliVariables);
  it = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
        *)std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
          ::end(&this->UsedCliVariables);
  while( true ) {
    bVar2 = std::operator!=(&__end1,(_Self *)&it);
    if (!bVar2) break;
    local_1c0 = std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
                ::operator*(&__end1);
    if ((local_1c0->second & 1U) == 0) {
      bVar1 = true;
      poVar3 = std::operator<<((ostream *)local_190,"\n  ");
      std::operator<<(poVar3,(string *)local_1c0);
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
    ::operator++(&__end1);
  }
  if (bVar1) {
    std::__cxx11::ostringstream::str();
    local_1f8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    local_1f8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    cmListFileBacktrace::cmListFileBacktrace(&local_1f8);
    IssueMessage(this,WARNING,&local_1e0,&local_1f8);
    cmListFileBacktrace::~cmListFileBacktrace(&local_1f8);
    std::__cxx11::string::~string((string *)&local_1e0);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  return;
}

Assistant:

void cmake::RunCheckForUnusedVariables()
{
#ifndef CMAKE_BOOTSTRAP
  bool haveUnused = false;
  std::ostringstream msg;
  msg << "Manually-specified variables were not used by the project:";
  for (auto const& it : this->UsedCliVariables) {
    if (!it.second) {
      haveUnused = true;
      msg << "\n  " << it.first;
    }
  }
  if (haveUnused) {
    this->IssueMessage(MessageType::WARNING, msg.str());
  }
#endif
}